

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

UString * jsonnet::internal::jsonnet_string_escape
                    (UString *__return_storage_ptr__,UString *str,bool single)

{
  ulong uVar1;
  long lVar2;
  char32_t cVar3;
  char32_t cVar4;
  char32_t *__s;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  UString r;
  UStringStream ss;
  stringstream ss8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_230;
  long *local_210;
  ulong local_208;
  long local_200 [2];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_1f0;
  UString *local_1d0;
  char32_t *local_1c8;
  char32_t *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = L'\0';
  if (str->_M_string_length != 0) {
    local_1c0 = L"\'";
    if (single) {
      local_1c0 = L"\\\'";
    }
    local_1c8 = L"\\\"";
    if (single) {
      local_1c8 = L"\"";
    }
    uVar8 = 0;
    local_1d0 = __return_storage_ptr__;
    do {
      cVar4 = (str->_M_dataplus)._M_p[uVar8];
      if (L'!' < cVar4) {
        if (cVar4 == L'\\') {
          __s = L"\\\\";
        }
        else {
          __s = local_1c0;
          if ((cVar4 != L'\'') && (__s = local_1c8, cVar4 != L'\"')) goto switchD_001881e9_caseD_1;
        }
        goto LAB_001884d3;
      }
      switch(cVar4) {
      case L'\0':
        __s = L"\\u0000";
        break;
      default:
switchD_001881e9_caseD_1:
        if ((uint)cVar4 < 0x20 || (uint)(cVar4 + L'\xffffff81') < 0x21) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\u",2);
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          lVar2 = *(long *)(local_1a8[0] + -0x18);
          if (acStack_c8[lVar2 + 1] == '\0') {
            std::ios::widen((char)local_1a8 + (char)lVar2);
            acStack_c8[lVar2 + 1] = '\x01';
          }
          acStack_c8[lVar2] = '0';
          *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 4;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          local_230._M_string_length = 0;
          local_230.field_2._M_local_buf[0] = L'\0';
          if (local_208 != 0) {
            uVar7 = 0;
            do {
              cVar3 = (char32_t)*(char *)((long)local_210 + uVar7);
              cVar4 = cVar3;
              if (*(char *)((long)local_210 + uVar7) < '\0') {
                if ((cVar3 & 0xe0U) == 0xc0) {
                  uVar1 = uVar7 + 1;
                  cVar4 = L'�';
                  if ((uVar1 < local_208) &&
                     (uVar7 = uVar1,
                     cVar4 = *(byte *)((long)local_210 + uVar1) & 0x3f | (cVar3 & 0x1fU) << 6,
                     (*(byte *)((long)local_210 + uVar1) & 0xc0) != 0x80)) {
                    cVar4 = L'�';
                  }
                }
                else if ((cVar3 & 0xf0U) == 0xe0) {
                  uVar1 = uVar7 + 2;
                  cVar4 = L'�';
                  if (uVar1 < local_208) {
                    uVar5 = (uint)*(char *)((long)local_210 + uVar7 + 1);
                    if ((uVar5 & 0xc0) == 0x80) {
                      uVar7 = uVar1;
                      if ((*(byte *)((long)local_210 + uVar1) & 0xffffffc0) == 0x80) {
                        cVar4 = *(byte *)((long)local_210 + uVar1) & 0x3f |
                                (uVar5 & 0x3f) << 6 | (cVar3 & 0xfU) << 0xc;
                      }
                    }
                    else {
LAB_00188479:
                      uVar7 = uVar7 + 1;
                      cVar4 = L'�';
                    }
                  }
                }
                else {
                  uVar1 = uVar7 + 3;
                  cVar4 = L'�';
                  if ((uVar1 < local_208) && ((cVar3 & 0xf8U) == 0xf0)) {
                    uVar5 = (uint)*(char *)((long)local_210 + uVar7 + 1);
                    if ((uVar5 & 0xc0) != 0x80) goto LAB_00188479;
                    uVar6 = (uint)*(char *)((long)local_210 + uVar7 + 2);
                    if ((uVar6 & 0xc0) == 0x80) {
                      uVar7 = uVar1;
                      if ((*(byte *)((long)local_210 + uVar1) & 0xffffffc0) == 0x80) {
                        cVar4 = *(byte *)((long)local_210 + uVar1) & 0x3f |
                                (uVar6 & 0x3f) << 6 | (uVar5 & 0x3f) << 0xc | (cVar3 & 7U) << 0x12;
                      }
                    }
                    else {
                      uVar7 = uVar7 + 2;
                    }
                  }
                }
              }
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
              push_back(&local_230,cVar4);
              uVar7 = uVar7 + 1;
            } while (uVar7 < local_208);
          }
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::_M_append
                    (&local_1f0,local_230._M_dataplus._M_p,local_230._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT44(local_230.field_2._M_local_buf[1],
                                     local_230.field_2._M_local_buf[0]) * 4 + 4);
          }
          if (local_210 != local_200) {
            operator_delete(local_210,local_200[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (&local_1f0,cVar4);
        }
        goto LAB_001884db;
      case L'\b':
        __s = L"\\b";
        break;
      case L'\t':
        __s = L"\\t";
        break;
      case L'\n':
        __s = L"\\n";
        break;
      case L'\f':
        __s = L"\\f";
        break;
      case L'\r':
        __s = L"\\r";
      }
LAB_001884d3:
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      append(&local_1f0,__s);
LAB_001884db:
      uVar8 = uVar8 + 1;
      __return_storage_ptr__ = local_1d0;
    } while (uVar8 < str->_M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)__return_storage_ptr__,local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT44(local_1f0.field_2._M_local_buf[1],local_1f0.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

UString jsonnet_string_escape(const UString &str, bool single)
{
    UStringStream ss;
    for (std::size_t i = 0; i < str.length(); ++i) {
        char32_t c = str[i];
        switch (c) {
            case U'\"': ss << (single ? U"\"" : U"\\\""); break;
            case U'\'': ss << (single ? U"\\\'" : U"\'"); break;
            case U'\\': ss << U"\\\\"; break;
            case U'\b': ss << U"\\b"; break;
            case U'\f': ss << U"\\f"; break;
            case U'\n': ss << U"\\n"; break;
            case U'\r': ss << U"\\r"; break;
            case U'\t': ss << U"\\t"; break;
            case U'\0': ss << U"\\u0000"; break;
            default: {
                if (c < 0x20 || (c >= 0x7f && c <= 0x9f)) {
                    // Unprintable, use \u
                    std::stringstream ss8;
                    ss8 << "\\u" << std::hex << std::setfill('0') << std::setw(4)
                        << (unsigned long)(c);
                    ss << decode_utf8(ss8.str());
                } else {
                    // Printable, write verbatim
                    ss << c;
                }
            }
        }
    }
    return ss.str();
}